

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O1

void * __thiscall
tvm::runtime::WorkspacePool::Pool::Alloc(Pool *this,TVMContext ctx,DeviceAPI *device,size_t nbytes)

{
  pointer *ppEVar1;
  undefined8 *puVar2;
  pointer pEVar3;
  iterator __position;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  Entry e;
  Entry local_38;
  
  uVar6 = nbytes + 0xfff & 0xfffffffffffff000;
  uVar8 = 0x1000;
  if (uVar6 != 0) {
    uVar8 = uVar6;
  }
  pEVar3 = (this->free_list_).
           super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pEVar3 -
          (long)(this->free_list_).
                super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (lVar5 != 1) {
    if (lVar5 == 2) {
      local_38.data = pEVar3[-1].data;
      local_38.size = pEVar3[-1].size;
      (this->free_list_).
      super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
      ._M_impl.super__Vector_impl_data._M_finish = pEVar3 + -1;
      if (uVar8 <= local_38.size) goto LAB_0010a732;
    }
    else {
      if (uVar8 <= pEVar3[-1].size) {
        lVar5 = 0x10;
        do {
          lVar7 = lVar5;
          lVar5 = lVar7 + -0x10;
        } while (uVar8 <= *(ulong *)((long)pEVar3 + lVar7 + -0x28));
        puVar2 = (undefined8 *)((long)&pEVar3[-2].data + lVar7);
        local_38.data = (void *)*puVar2;
        local_38.size = puVar2[1];
        if (lVar5 != 0) {
          memmove((void *)((long)&pEVar3[-2].data + lVar7),(void *)((long)&pEVar3[-1].data + lVar7),
                  -lVar5);
        }
        ppEVar1 = &(this->free_list_).
                   super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppEVar1 = *ppEVar1 + -1;
        goto LAB_0010a732;
      }
      local_38.data = pEVar3[-1].data;
      local_38.size = pEVar3[-1].size;
      (this->free_list_).
      super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
      ._M_impl.super__Vector_impl_data._M_finish = pEVar3 + -1;
    }
    (*device->_vptr_DeviceAPI[5])(device,ctx,local_38.data);
  }
  iVar4 = (*device->_vptr_DeviceAPI[4])(device,ctx,uVar8,0x40,0x10801);
  local_38.data = (void *)CONCAT44(extraout_var,iVar4);
  local_38.size = uVar8;
LAB_0010a732:
  __position._M_current =
       (this->allocated_).
       super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->allocated_).
      super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
    ::_M_realloc_insert<tvm::runtime::WorkspacePool::Pool::Entry_const&>
              ((vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
                *)&this->allocated_,__position,&local_38);
  }
  else {
    (__position._M_current)->data = local_38.data;
    (__position._M_current)->size = local_38.size;
    ppEVar1 = &(this->allocated_).
               super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  return local_38.data;
}

Assistant:

void *Alloc(TVMContext ctx, DeviceAPI *device, size_t nbytes) {
    // Allocate align to page.
    nbytes = (nbytes + (kWorkspacePageSize - 1)) / kWorkspacePageSize * kWorkspacePageSize;
    if (nbytes == 0)
      nbytes = kWorkspacePageSize;
    Entry e;
    TVMType type;
    type.code = kDLUInt;
    type.bits = 8;
    type.lanes = 1;
    if (free_list_.size() == 2) {
      e = free_list_.back();
      free_list_.pop_back();
      if (e.size < nbytes) {
        // resize the page
        device->FreeDataSpace(ctx, e.data);
        e.data = device->AllocDataSpace(ctx, nbytes, kTempAllocaAlignment, type);
        e.size = nbytes;
      }
    } else if (free_list_.size() == 1) {
      e.data = device->AllocDataSpace(ctx, nbytes, kTempAllocaAlignment, type);
      e.size = nbytes;
    } else {
      if (free_list_.back().size >= nbytes) {
        // find smallest fit
        auto it = free_list_.end() - 2;
        for (; it->size >= nbytes; --it) {
        }
        e = *(it + 1);
        free_list_.erase(it + 1);
      } else {
        // resize the page
        e = free_list_.back();
        free_list_.pop_back();
        device->FreeDataSpace(ctx, e.data);
        e.data = device->AllocDataSpace(ctx, nbytes, kTempAllocaAlignment, type);
        e.size = nbytes;
      }
    }
    allocated_.push_back(e);
    return e.data;
  }